

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

bool __thiscall
QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString>::isNull
          (QStringBuilder<const_QStringBuilder<QLatin1String,_QStringView_&>_&,_QString> *this)

{
  if (((this->a->a).m_data == (char *)0x0) && (this->a->b->m_data == (storage_type_conflict *)0x0))
  {
    return (this->b).d.ptr == (char16_t *)0x0;
  }
  return false;
}

Assistant:

bool isNull() const
    {
        return QtStringBuilder::isNull(a) && QtStringBuilder::isNull(b);
    }